

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void finish(cbify *data)

{
  action_score *__ptr;
  example *peVar1;
  float *__ptr_00;
  pointer ppeVar2;
  ulong uVar3;
  
  (*(code *)PTR_delete_label_002d1af8)();
  __ptr = (data->a_s)._begin;
  if (__ptr != (action_score *)0x0) {
    free(__ptr);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  if (data->use_adf == true) {
    if ((data->adf_data).num_actions != 0) {
      uVar3 = 0;
      do {
        peVar1 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3];
        __ptr_00 = (peVar1->pred).scalars._begin;
        if (__ptr_00 != (float *)0x0) {
          free(__ptr_00);
        }
        (peVar1->pred).scalars._begin = (float *)0x0;
        (peVar1->pred).scalars._end = (float *)0x0;
        (peVar1->pred).scalars.end_array = (float *)0x0;
        VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002d1af8,
                            (data->adf_data).ecs.
                            super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3],(_func_void_void_ptr *)0x0);
        peVar1 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3];
        if (peVar1 != (example *)0x0) {
          free(peVar1);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (data->adf_data).num_actions);
    }
    ppeVar2 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (ppeVar2 != (pointer)0x0) {
      operator_delete(ppeVar2);
      return;
    }
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();
  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
    {
      data.adf_data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
      free_it(data.adf_data.ecs[a]);
    }
    data.adf_data.ecs.~vector<example*>();
  }
}